

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AntennaLocation.cpp
# Opt level: O0

KString * __thiscall
KDIS::DATA_TYPE::AntennaLocation::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,AntennaLocation *this)

{
  ostream *poVar1;
  KString local_1f0;
  KString local_1d0;
  stringstream local_1a0 [8];
  KStringStream ss;
  ostream local_190 [376];
  AntennaLocation *local_18;
  AntennaLocation *this_local;
  
  local_18 = this;
  this_local = (AntennaLocation *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a0);
  poVar1 = std::operator<<(local_190,"Antenna Location:\n");
  poVar1 = std::operator<<(poVar1,"\tWorld Location:       ");
  WorldCoordinates::GetAsString_abi_cxx11_(&local_1d0,&this->m_AntennaLocation);
  poVar1 = std::operator<<(poVar1,(string *)&local_1d0);
  poVar1 = std::operator<<(poVar1,"\tEntity Location:      ");
  Vector::GetAsString_abi_cxx11_(&local_1f0,&this->m_RelativeAntennaLocation);
  std::operator<<(poVar1,(string *)&local_1f0);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

KString AntennaLocation::GetAsString() const
{
    KStringStream ss;

    ss << "Antenna Location:\n"
       << "\tWorld Location:       " << m_AntennaLocation.GetAsString()
       << "\tEntity Location:      " << m_RelativeAntennaLocation.GetAsString();

    return ss.str();
}